

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall cmCTestBZR::~cmCTestBZR(cmCTestBZR *this)

{
  ~cmCTestBZR(this);
  operator_delete(this,0x330);
  return;
}

Assistant:

cmCTestBZR::~cmCTestBZR() = default;